

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  UnknownFieldSet *debug_msg_name_00;
  string *innermost_field_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  Type TVar4;
  UnknownField *pUVar5;
  reference ppFVar6;
  UnknownFieldSet *unknown_fields_00;
  LogMessage *pLVar7;
  string_view data;
  LogMessage local_e8;
  Voidify local_d1;
  const_iterator local_d0;
  const_iterator local_c8;
  int local_bc;
  OptionInterpreter *local_b8;
  FieldDescriptor **local_b0;
  string_view local_98;
  undefined1 local_88 [8];
  UnknownFieldSet intermediate_unknown_fields;
  Type type;
  UnknownField *unknown_field;
  anon_class_8_1_84377f33 aStack_60;
  int i_1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_58;
  int local_44;
  UnknownFieldSet *pUStack_40;
  int i;
  UnknownFieldSet *unknown_fields_local;
  string *debug_msg_name_local;
  FieldDescriptor *innermost_field_local;
  OptionInterpreter *this_local;
  const_iterator intermediate_fields_end_local;
  const_iterator intermediate_fields_iter_local;
  
  pUStack_40 = unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)debug_msg_name;
  debug_msg_name_local = (string *)innermost_field;
  innermost_field_local = (FieldDescriptor *)this;
  this_local = (OptionInterpreter *)intermediate_fields_end._M_current;
  intermediate_fields_end_local = intermediate_fields_iter;
  bVar1 = __gnu_cxx::operator==
                    (&intermediate_fields_end_local,
                     (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                      *)&this_local);
  if (bVar1) {
    for (local_44 = 0; iVar2 = local_44, iVar3 = UnknownFieldSet::field_count(pUStack_40),
        iVar2 < iVar3; local_44 = local_44 + 1) {
      pUVar5 = UnknownFieldSet::field(pUStack_40,local_44);
      iVar2 = UnknownField::number(pUVar5);
      iVar3 = FieldDescriptor::number((FieldDescriptor *)debug_msg_name_local);
      if (iVar2 == iVar3) {
        aStack_60.debug_msg_name = (string *)unknown_fields_local;
        absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
        FunctionRef<google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,google::protobuf::FieldDescriptor_const*,std::__cxx11::string_const&,google::protobuf::UnknownFieldSet_const&)::__0,void>
                  ((FunctionRef<std::__cxx11::string()> *)&local_58,&stack0xffffffffffffffa0);
        intermediate_fields_iter_local._M_current._7_1_ = AddNameError(this,local_58);
        goto LAB_001794ce;
      }
    }
    intermediate_fields_iter_local._M_current._7_1_ = 1;
  }
  else {
    unknown_field._4_4_ = 0;
    while( true ) {
      iVar2 = UnknownFieldSet::field_count(pUStack_40);
      if (iVar2 <= unknown_field._4_4_) break;
      pUVar5 = UnknownFieldSet::field(pUStack_40,unknown_field._4_4_);
      iVar2 = UnknownField::number(pUVar5);
      ppFVar6 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&intermediate_fields_end_local);
      iVar3 = FieldDescriptor::number(*ppFVar6);
      if (iVar2 == iVar3) {
        pUVar5 = UnknownFieldSet::field(pUStack_40,unknown_field._4_4_);
        ppFVar6 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&intermediate_fields_end_local);
        intermediate_unknown_fields.fields_.soo_rep_.field_0.long_rep.capacity =
             FieldDescriptor::type(*ppFVar6);
        if (intermediate_unknown_fields.fields_.soo_rep_.field_0.long_rep.capacity == TYPE_GROUP) {
          TVar4 = UnknownField::type(pUVar5);
          if (TVar4 == TYPE_GROUP) {
            local_c8._M_current =
                 (FieldDescriptor **)
                 __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 ::operator+(&intermediate_fields_end_local,1);
            innermost_field_00 = debug_msg_name_local;
            debug_msg_name_00 = unknown_fields_local;
            local_d0._M_current = (FieldDescriptor **)this_local;
            unknown_fields_00 = UnknownField::group(pUVar5);
            bVar1 = ExamineIfOptionIsSet
                              (this,local_c8,local_d0,(FieldDescriptor *)innermost_field_00,
                               (string *)debug_msg_name_00,unknown_fields_00);
            if (!bVar1) {
              intermediate_fields_iter_local._M_current._7_1_ = 0;
              goto LAB_001794ce;
            }
          }
        }
        else {
          if (intermediate_unknown_fields.fields_.soo_rep_.field_0.long_rep.capacity != TYPE_MESSAGE
             ) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                       ,0x2679);
            pLVar7 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e8);
            pLVar7 = absl::lts_20250127::log_internal::LogMessage::operator<<
                               (pLVar7,(char (*) [40])"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar7 = absl::lts_20250127::log_internal::LogMessage::
                     operator<<<google::protobuf::internal::FieldDescriptorLite::Type,_0>
                               (pLVar7,(Type *)&intermediate_unknown_fields.fields_.soo_rep_.field_0
                                                .long_rep.capacity);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_d1,pLVar7);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_e8);
          }
          TVar4 = UnknownField::type(pUVar5);
          if (TVar4 == TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)local_88);
            data = UnknownField::length_delimited(pUVar5);
            local_98 = data;
            bVar1 = UnknownFieldSet::ParseFromString((UnknownFieldSet *)local_88,data);
            if (bVar1) {
              local_b0 = (FieldDescriptor **)
                         __gnu_cxx::
                         __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                         ::operator+(&intermediate_fields_end_local,1);
              local_b8 = this_local;
              bVar1 = ExamineIfOptionIsSet
                                (this,(const_iterator)local_b0,(const_iterator)this_local,
                                 (FieldDescriptor *)debug_msg_name_local,
                                 (string *)unknown_fields_local,(UnknownFieldSet *)local_88);
              if (bVar1) goto LAB_00179359;
              intermediate_fields_iter_local._M_current._7_1_ = 0;
              local_bc = 1;
            }
            else {
LAB_00179359:
              local_bc = 0;
            }
            UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)local_88);
            if (local_bc != 0) goto LAB_001794ce;
          }
        }
      }
      unknown_field._4_4_ = unknown_field._4_4_ + 1;
    }
    intermediate_fields_iter_local._M_current._7_1_ = 1;
  }
LAB_001794ce:
  return (bool)(intermediate_fields_iter_local._M_current._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError([&] {
          return absl::StrCat("Option \"", debug_msg_name,
                              "\" was already set.");
        });
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          ABSL_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}